

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ptr<Expression> __thiscall Parser::call(Parser *this,ptr<Expression> *callee)

{
  vector<std::shared_ptr<Expression>,_std::allocator<std::shared_ptr<Expression>_>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Expression> pVar1;
  shared_ptr<Expression> local_78;
  shared_ptr<Call> local_68;
  undefined1 local_58 [8];
  ptr<Expression> expr;
  undefined1 local_38 [8];
  ExpressionList exprList;
  ptr<Expression> *callee_local;
  Parser *this_local;
  
  consume((Parser *)callee);
  expressionList((ExpressionList *)local_38,(Parser *)callee);
  consume((Parser *)callee,RightParen,"\')\'");
  make<Call,std::shared_ptr<Expression>&,std::vector<std::shared_ptr<Expression>,std::allocator<std::shared_ptr<Expression>>>&>
            ((shared_ptr<Expression> *)&local_68,in_RDX);
  std::shared_ptr<Expression>::shared_ptr<Call,void>((shared_ptr<Expression> *)local_58,&local_68);
  std::shared_ptr<Call>::~shared_ptr(&local_68);
  std::shared_ptr<Expression>::shared_ptr(&local_78,(shared_ptr<Expression> *)local_58);
  postfix(this,callee);
  std::shared_ptr<Expression>::~shared_ptr(&local_78);
  std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)local_58);
  std::vector<std::shared_ptr<Expression>,_std::allocator<std::shared_ptr<Expression>_>_>::~vector
            ((vector<std::shared_ptr<Expression>,_std::allocator<std::shared_ptr<Expression>_>_> *)
             local_38);
  pVar1.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar1.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::call(ptr<Expression> callee) {
    consume();
    ExpressionList exprList = expressionList();
    consume(TokenType::RightParen, "')'");

    ptr<Expression> expr = make<Call>(callee, exprList);
    return postfix(expr);
}